

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O3

bool __thiscall APowerup::HandlePickup(APowerup *this,AInventory *item)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  PClass *pPVar4;
  uint uVar5;
  APowerup *power;
  PClass *pPVar3;
  undefined4 extraout_var_00;
  
  pPVar3 = (item->super_AActor).super_DThinker.super_DObject.Class;
  if (pPVar3 == (PClass *)0x0) {
    iVar2 = (**(item->super_AActor).super_DThinker.super_DObject._vptr_DObject)(item);
    pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
    (item->super_AActor).super_DThinker.super_DObject.Class = pPVar3;
  }
  pPVar4 = (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class;
  if (pPVar4 == (PClass *)0x0) {
    iVar2 = (**(this->super_AInventory).super_AActor.super_DThinker.super_DObject._vptr_DObject)
                      (this);
    pPVar4 = (PClass *)CONCAT44(extraout_var_00,iVar2);
    (this->super_AInventory).super_AActor.super_DThinker.super_DObject.Class = pPVar4;
  }
  if (pPVar3 != pPVar4) goto LAB_004a14a3;
  uVar5 = item->ItemFlags;
  iVar2 = *(int *)&item->field_0x4fc;
  if (iVar2 != 0) {
    iVar1 = *(int *)&(this->super_AInventory).field_0x4fc;
    if ((uVar5 >> 9 & 1) == 0) {
      if ((uVar5 >> 10 & 1) == 0 && 0x80 < iVar1) goto LAB_004a14a3;
      if (iVar1 < iVar2) goto LAB_004a1480;
    }
    else {
      iVar2 = iVar2 + iVar1;
LAB_004a1480:
      *(int *)&(this->super_AInventory).field_0x4fc = iVar2;
      (this->BlendColor).field_0 = *(anon_union_4_2_12391d7c_for_PalEntry_0 *)(item + 1);
    }
    uVar5 = item->ItemFlags;
  }
  item->ItemFlags = uVar5 | 4;
LAB_004a14a3:
  return pPVar3 == pPVar4;
}

Assistant:

bool APowerup::HandlePickup (AInventory *item)
{
	if (item->GetClass() == GetClass())
	{
		APowerup *power = static_cast<APowerup*>(item);
		if (power->EffectTics == 0)
		{
			power->ItemFlags |= IF_PICKUPGOOD;
			return true;
		}
		// Color gets transferred if the new item has an effect.

		// Increase the effect's duration.
		if (power->ItemFlags & IF_ADDITIVETIME) 
		{
			EffectTics += power->EffectTics;
			BlendColor = power->BlendColor;
		}
		// If it's not blinking yet, you can't replenish the power unless the
		// powerup is required to be picked up.
		else if (EffectTics > BLINKTHRESHOLD && !(power->ItemFlags & IF_ALWAYSPICKUP))
		{
			return true;
		}
		// Reset the effect duration.
		else if (power->EffectTics > EffectTics)
		{
			EffectTics = power->EffectTics;
			BlendColor = power->BlendColor;
		}
		power->ItemFlags |= IF_PICKUPGOOD;
		return true;
	}
	return false;
}